

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rp__findresult nk_rp__skyline_pack_rectangle(nk_rp_context *context,int width,int height)

{
  nk_rp_node *pnVar1;
  nk_rp_node *pnVar2;
  bool bVar3;
  nk_rp_node *next_1;
  nk_rp_node *next;
  nk_rp_node *cur;
  nk_rp_node *node;
  int height_local;
  int width_local;
  nk_rp_context *context_local;
  nk_rp__findresult res;
  
  _context_local = nk_rp__skyline_find_best_pos(context,width,height);
  if (((res._0_8_ == 0) || (context->height < context_local._4_4_ + height)) ||
     (context->free_head == (nk_rp_node *)0x0)) {
    res._0_8_ = (nk_rp_node **)0x0;
  }
  else {
    pnVar1 = context->free_head;
    pnVar1->x = (nk_rp_coord)context_local;
    pnVar1->y = context_local._4_2_ + (short)height;
    context->free_head = pnVar1->next;
    next = *(nk_rp_node **)res._0_8_;
    if ((int)(uint)next->x < (int)context_local) {
      pnVar2 = next->next;
      next->next = pnVar1;
      next = pnVar2;
    }
    else {
      *(nk_rp_node **)res._0_8_ = pnVar1;
    }
    while( true ) {
      bVar3 = false;
      if (next->next != (nk_rp_node *)0x0) {
        bVar3 = (int)(uint)next->next->x <= (int)context_local + width;
      }
      if (!bVar3) break;
      pnVar2 = next->next;
      next->next = context->free_head;
      context->free_head = next;
      next = pnVar2;
    }
    pnVar1->next = next;
    if ((int)(uint)next->x < (int)context_local + width) {
      next->x = (nk_rp_coord)context_local + (short)width;
    }
  }
  return _context_local;
}

Assistant:

NK_INTERN struct nk_rp__findresult
nk_rp__skyline_pack_rectangle(struct nk_rp_context *context, int width, int height)
{
    /* find best position according to heuristic */
    struct nk_rp__findresult res = nk_rp__skyline_find_best_pos(context, width, height);
    struct nk_rp_node *node, *cur;

    /* bail if: */
    /*    1. it failed */
    /*    2. the best node doesn't fit (we don't always check this) */
    /*    3. we're out of memory */
    if (res.prev_link == 0 || res.y + height > context->height || context->free_head == 0) {
        res.prev_link = 0;
        return res;
    }

    /* on success, create new node */
    node = context->free_head;
    node->x = (nk_rp_coord) res.x;
    node->y = (nk_rp_coord) (res.y + height);

    context->free_head = node->next;

    /* insert the new node into the right starting point, and */
    /* let 'cur' point to the remaining nodes needing to be */
    /* stitched back in */
    cur = *res.prev_link;
    if (cur->x < res.x) {
        /* preserve the existing one, so start testing with the next one */
        struct nk_rp_node *next = cur->next;
        cur->next = node;
        cur = next;
    } else {
        *res.prev_link = node;
    }

    /* from here, traverse cur and free the nodes, until we get to one */
    /* that shouldn't be freed */
    while (cur->next && cur->next->x <= res.x + width) {
        struct nk_rp_node *next = cur->next;
        /* move the current node to the free list */
        cur->next = context->free_head;
        context->free_head = cur;
        cur = next;
    }
    /* stitch the list back in */
    node->next = cur;

    if (cur->x < res.x + width)
        cur->x = (nk_rp_coord) (res.x + width);
    return res;
}